

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

int __thiscall
booster::locale::impl_posix::collator<char>::do_compare
          (collator<char> *this,char_type *lb,char_type *le,char_type *rb,char_type *re)

{
  char *right_00;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  size_t sVar1;
  char *in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_R8;
  int res;
  string_type right;
  string_type left;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  long local_30;
  char *local_28;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RSI,in_RDX - (long)in_RSI,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_28,local_30 - (long)local_28,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  right_00 = (char *)std::__cxx11::string::c_str();
  this_00 = (__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::__cxx11::string::c_str();
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (this_00);
  sVar1 = coll_traits<char>::coll((char *)this_00,right_00,(locale_t)0x2837b6);
  if ((int)sVar1 < 0) {
    local_4 = -1;
  }
  else if ((int)sVar1 < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  return local_4;
}

Assistant:

virtual int do_compare(char_type const *lb,char_type const *le,char_type const *rb,char_type const *re) const
    {
        string_type left(lb,le-lb);
        string_type right(rb,re-rb);
        int res = coll_traits<char_type>::coll(left.c_str(),right.c_str(),*lc_);
        if(res < 0)
            return -1;
        if(res > 0)
            return 1;
        return 0;
    }